

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::for_statement::print(for_statement *this,wostream *os)

{
  bool bVar1;
  wostream *os_00;
  syntax_node *psVar2;
  wostream *os_local;
  for_statement *this_local;
  
  std::operator<<(os,"for_statement{");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->init_);
  if (bVar1) {
    psVar2 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                        (&this->init_)->super_syntax_node;
    mjs::operator<<(os,psVar2);
  }
  else {
    std::operator<<(os,"{}");
  }
  std::operator<<(os,',');
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->cond_);
  if (bVar1) {
    psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                        (&this->cond_)->super_syntax_node;
    mjs::operator<<(os,psVar2);
  }
  else {
    std::operator<<(os,"{}");
  }
  std::operator<<(os,',');
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->iter_);
  if (bVar1) {
    psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                        (&this->iter_)->super_syntax_node;
    mjs::operator<<(os,psVar2);
  }
  else {
    std::operator<<(os,"{}");
  }
  os_00 = std::operator<<(os,',');
  psVar2 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                      (&this->s_)->super_syntax_node;
  mjs::operator<<(os_00,psVar2);
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "for_statement{";
        if (init_) os << *init_; else os << "{}";
        os << ',';
        if (cond_) os << *cond_; else os << "{}";
        os << ',';
        if (iter_) os << *iter_; else os << "{}";
        os << ',' << *s_;
        os << "}";
    }